

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
create_superroot(Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this
                )

{
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *this_00;
  AlexNode<int,_int> **ppAVar1;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RDI;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *unaff_retaddr;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffffb8;
  allocator<std::pair<int,_int>_> *in_stack_ffffffffffffffc0;
  undefined1 *__n;
  new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
  *in_stack_ffffffffffffffd0;
  
  if (in_RDI->root_node_ != (AlexNode<int,_int> *)0x0) {
    delete_node(unaff_retaddr,(AlexNode<int,_int> *)in_RDI);
    __n = &stack0xfffffffffffffff7;
    model_node_allocator(in_stack_ffffffffffffffb8);
    this_00 = __gnu_cxx::
              new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
              allocate(in_stack_ffffffffffffffd0,(size_type)__n,in_stack_ffffffffffffffc0);
    AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
              (this_00,(short)((ulong)__n >> 0x30),in_stack_ffffffffffffffc0);
    in_RDI->superroot_ = this_00;
    std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
    ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *)
               0x13a786);
    in_RDI->superroot_->num_children_ = 1;
    pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                       *)&stack0xffffffffffffffe3);
    ppAVar1 = __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                        ((new_allocator<alex::AlexNode<int,_int>_*> *)this_00,(size_type)__n,
                         in_stack_ffffffffffffffc0);
    in_RDI->superroot_->children_ = ppAVar1;
    std::allocator<alex::AlexNode<int,_int>_*>::~allocator
              ((allocator<alex::AlexNode<int,_int>_*> *)0x13a7d9);
    update_superroot_pointer(in_RDI);
  }
  return;
}

Assistant:

void create_superroot() {
    if (!root_node_) return;
    delete_node(superroot_);
    superroot_ = new (model_node_allocator().allocate(1))
        model_node_type(static_cast<short>(root_node_->level_ - 1), allocator_);
    superroot_->num_children_ = 1;
    superroot_->children_ =
        new (pointer_allocator().allocate(1)) AlexNode<T, P>*[1];
    update_superroot_pointer();
  }